

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t __n;
  int iVar2;
  byte *pbVar3;
  char **ppcVar4;
  ulong uVar5;
  char *local_48;
  
  ppcVar4 = ssl->conf->alpn_list;
  iVar2 = 0;
  if (((ppcVar4 != (char **)0x0) && (iVar2 = -0x7900, 3 < len)) &&
     ((ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8) == len - 2)) {
    local_48 = *ppcVar4;
    if (local_48 != (char *)0x0) {
      do {
        __n = strlen(local_48);
        pbVar3 = buf + 2;
        do {
          if (buf + len < pbVar3) {
            return -0x7900;
          }
          uVar5 = (ulong)*pbVar3;
          if (uVar5 == 0) {
            return -0x7900;
          }
          if ((__n == uVar5) && (iVar1 = bcmp(pbVar3 + 1,local_48,__n), iVar1 == 0)) {
            ssl->alpn_chosen = local_48;
            return 0;
          }
          pbVar3 = pbVar3 + 1 + uVar5;
        } while (pbVar3 != buf + len);
        local_48 = ppcVar4[1];
        ppcVar4 = ppcVar4 + 1;
      } while (local_48 != (char *)0x0);
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','x');
  }
  return iVar2;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, name_len;
    const char **p;

    /* If we didn't send it, the server shouldn't send it */
    if( ssl->conf->alpn_list == NULL )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     *
     * the "ProtocolNameList" MUST contain exactly one "ProtocolName"
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    name_len = buf[2];
    if( name_len != list_len - 1 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /* Check that the server chosen protocol was in our list and save it */
    for( p = ssl->conf->alpn_list; *p != NULL; p++ )
    {
        if( name_len == strlen( *p ) &&
            memcmp( buf + 3, *p, name_len ) == 0 )
        {
            ssl->alpn_chosen = *p;
            return( 0 );
        }
    }

    return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
}